

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-parsing-utils.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  greatest_test_res gVar2;
  greatest_test_res res_4;
  greatest_test_res res_3;
  greatest_test_res res_2;
  greatest_test_res res_1;
  greatest_test_res res;
  char **argv_local;
  int argc_local;
  
  GREATEST_INIT();
  greatest_parse_options(argc,argv);
  iVar1 = greatest_test_pre("parsing_int32");
  if (iVar1 == 1) {
    gVar2 = parsing_int32();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("parsing_float");
  if (iVar1 == 1) {
    gVar2 = parsing_float();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("parsing_double");
  if (iVar1 == 1) {
    gVar2 = parsing_double();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("parsing_usize");
  if (iVar1 == 1) {
    gVar2 = parsing_usize();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("parsing_bool");
  if (iVar1 == 1) {
    gVar2 = parsing_bool();
    greatest_test_post(gVar2);
  }
  GREATEST_PRINT_REPORT();
  iVar1 = greatest_all_passed();
  return (uint)(iVar1 == 0);
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(parsing_int32);
    RUN_TEST(parsing_float);
    RUN_TEST(parsing_double);
    RUN_TEST(parsing_usize);
    RUN_TEST(parsing_bool);

    GREATEST_MAIN_END(); /* display results */
}